

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::AffineTransform::backward_impl
          (AffineTransform *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint uVar1;
  DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_> *this_00;
  DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_> *pDVar2;
  const_reference ppTVar3;
  uint *puVar4;
  long in_RCX;
  long in_RDX;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  uint in_R8D;
  long in_R9;
  int b_2;
  int max_b_1;
  int b_1;
  int max_b;
  uint b;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffca8;
  MatrixBase<Eigen::Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffcc0;
  Tensor *in_stack_fffffffffffffcc8;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffcd0;
  Tensor *in_stack_fffffffffffffcd8;
  NoAlias<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::MatrixBase>
  in_stack_fffffffffffffce0;
  uint bid;
  Tensor *in_stack_fffffffffffffce8;
  int local_274;
  int local_d8;
  uint local_8c;
  
  this_00 = (DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
             *)(ulong)in_R8D;
  pDVar2 = (DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
            *)std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::size(in_RSI);
  if (pDVar2 <= this_00) {
    __assert_fail("i < xs.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                  ,0x625,
                  "virtual void cnn::AffineTransform::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  if (in_R8D == 0) {
    if (*(int *)(in_RDX + 0x20) != 1) {
      __assert_fail("fx.d.bd == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                    ,0x62a,
                    "virtual void cnn::AffineTransform::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                   );
    }
    if ((*(uint *)(in_R9 + 0x20) < 2) || (*(int *)(in_RCX + 0x20) != 1)) {
      for (local_8c = 0; local_8c < *(uint *)(in_R9 + 0x20); local_8c = local_8c + 1) {
        Tensor::batch_matrix
                  (in_stack_fffffffffffffce8,
                   (uint)((ulong)in_stack_fffffffffffffce0.m_expression >> 0x20));
        Tensor::batch_matrix
                  (in_stack_fffffffffffffce8,
                   (uint)((ulong)in_stack_fffffffffffffce0.m_expression >> 0x20));
        Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
        operator+=(in_stack_fffffffffffffcd0,
                   (MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)in_stack_fffffffffffffcc8);
      }
    }
    else {
      Tensor::vec(in_stack_fffffffffffffcc8);
      Tensor::rowcol_matrix(in_stack_fffffffffffffce8);
      Eigen::
      DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
      colwise(this_00);
      Eigen::VectorwiseOp<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,0>::
      operator+=((VectorwiseOp<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  *)in_stack_fffffffffffffce0.m_expression,
                 (DenseBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)in_stack_fffffffffffffcd8);
    }
  }
  else if ((in_R8D & 1) == 1) {
    ppTVar3 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                        (in_RSI,(ulong)(in_R8D + 1));
    puVar4 = std::max<unsigned_int>((uint *)(in_RCX + 0x20),&((*ppTVar3)->d).bd);
    uVar1 = *puVar4;
    for (local_d8 = 0; local_d8 < (int)uVar1; local_d8 = local_d8 + 1) {
      Tensor::batch_matrix
                (in_stack_fffffffffffffce8,
                 (uint)((ulong)in_stack_fffffffffffffce0.m_expression >> 0x20));
      std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                (in_RSI,(ulong)(in_R8D + 1));
      Tensor::batch_matrix
                (in_stack_fffffffffffffce8,
                 (uint)((ulong)in_stack_fffffffffffffce0.m_expression >> 0x20));
      Eigen::
      DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
      transpose(this_00);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
      operator*((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
      Tensor::batch_matrix
                (in_stack_fffffffffffffce8,
                 (uint)((ulong)in_stack_fffffffffffffce0.m_expression >> 0x20));
      Eigen::
      MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
      noalias(in_stack_fffffffffffffca8);
      Eigen::
      NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
      ::operator+=((NoAlias<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::MatrixBase>
                    *)in_stack_fffffffffffffcd0,
                   (MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
                    *)in_stack_fffffffffffffcc8);
    }
  }
  else {
    ppTVar3 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                        (in_RSI,(ulong)(in_R8D - 1));
    puVar4 = std::max<unsigned_int>(&((*ppTVar3)->d).bd,(uint *)(in_RCX + 0x20));
    uVar1 = *puVar4;
    ppTVar3 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                        (in_RSI,(ulong)(in_R8D - 1));
    if (((*ppTVar3)->d).bd == 1) {
      std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                (in_RSI,(ulong)(in_R8D - 1));
      Tensor::operator*(in_stack_fffffffffffffcd8);
      Eigen::
      DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
      transpose(this_00);
      Tensor::colbatch_matrix(in_stack_fffffffffffffce8);
      Eigen::
      MatrixBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>>
      ::operator*((MatrixBase<Eigen::Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                   *)in_stack_fffffffffffffcc8,
                  (MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                   *)in_stack_fffffffffffffcc0);
      Tensor::colbatch_matrix(in_stack_fffffffffffffce8);
      Eigen::
      MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
      noalias(in_stack_fffffffffffffca8);
      Eigen::
      NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
      ::operator+=((NoAlias<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::MatrixBase>
                    *)in_stack_fffffffffffffcd0,
                   (MatrixBase<Eigen::Product<Eigen::Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                    *)in_stack_fffffffffffffcc8);
    }
    else {
      for (local_274 = 0; bid = (uint)((ulong)in_stack_fffffffffffffce0.m_expression >> 0x20),
          local_274 < (int)uVar1; local_274 = local_274 + 1) {
        std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                  (in_RSI,(ulong)(in_R8D - 1));
        Tensor::batch_matrix(in_stack_fffffffffffffce8,bid);
        Eigen::
        DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
        transpose(this_00);
        Tensor::batch_matrix(in_stack_fffffffffffffce8,bid);
        Eigen::
        MatrixBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>>
        ::operator*((MatrixBase<Eigen::Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                     *)in_stack_fffffffffffffcc8,
                    (MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                     *)in_stack_fffffffffffffcc0);
        Tensor::batch_matrix(in_stack_fffffffffffffce8,bid);
        in_stack_fffffffffffffce0 =
             Eigen::
             MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
             ::noalias(in_stack_fffffffffffffca8);
        Eigen::
        NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
        ::operator+=((NoAlias<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::MatrixBase>
                      *)in_stack_fffffffffffffcd0,
                     (MatrixBase<Eigen::Product<Eigen::Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                      *)in_stack_fffffffffffffcc8);
      }
    }
  }
  return;
}

Assistant:

void AffineTransform::backward_impl(const vector<const Tensor*>& xs,
                               const Tensor& fx,
                               const Tensor& dEdf,
                               unsigned i,
                               Tensor& dEdxi) const {
  assert(i < xs.size());
  if (i == 0) { // bias term
#if HAVE_CUDA
    CUBLAS_CHECK(cublasSaxpy(cublas_handle, dEdxi.d.size(), kSCALAR_ONE, dEdf.v, 1, dEdxi.v, 1));
#else
    assert(fx.d.bd == 1);
    // Add, using broadcasting or not
    if(dEdxi.d.bd > 1 && dEdf.d.bd == 1) {
      dEdxi.rowcol_matrix().colwise() += dEdf.vec();
    } else {
      for(unsigned b = 0; b < dEdxi.d.bd; ++b)
        dEdxi.batch_matrix(b) += dEdf.batch_matrix(b);
    }
#endif
  } else if (i % 2 == 1) { // left argument of matrix multiply
    int max_b = max(dEdf.d.bd, xs[i+1]->d.bd);
#if HAVE_CUDA
    for(int b = 0; b < max_b; ++b)
      CUBLAS_CHECK(cublasSgemm(cublas_handle, CUBLAS_OP_N, CUBLAS_OP_T,
            dEdxi.d.rows(), dEdxi.d.cols(), dEdf.d.cols(),
            kSCALAR_ONE,
            dEdf.batch_ptr(b), dEdf.d.rows(),
            xs[i+1]->batch_ptr(b), xs[i+1]->d.rows(),
            kSCALAR_ONE, dEdxi.batch_ptr(b), dEdxi.d.rows()));
#else
    for(int b = 0; b < max_b; ++b)
      dEdxi.batch_matrix(b).noalias() += dEdf.batch_matrix(b) * xs[i+1]->batch_matrix(b).transpose();
#endif
  } else {  // right argument of matrix multiply
    int max_b = max(xs[i-1]->d.bd, dEdf.d.bd);
#if HAVE_CUDA
    // TODO: Add reverse
    for(int b = 0; b < max_b; ++b)
      CUBLAS_CHECK(cublasSgemm(cublas_handle, CUBLAS_OP_T, CUBLAS_OP_N,
            dEdxi.d.rows(), dEdxi.d.cols(), xs[i-1]->d.rows(),
            kSCALAR_ONE,
            xs[i-1]->batch_ptr(b), xs[i-1]->d.rows(),
            dEdf.batch_ptr(b), xs[i-1]->d.rows(),
            kSCALAR_ONE, dEdxi.batch_ptr(b), dEdxi.d.rows()));
#else
    if(xs[i-1]->d.bd == 1) {
      dEdxi.colbatch_matrix().noalias() += (**xs[i-1]).transpose() * dEdf.colbatch_matrix();
    } else {
      for(int b = 0; b < max_b; ++b)
        dEdxi.batch_matrix(b).noalias() += xs[i-1]->batch_matrix(b).transpose() * dEdf.batch_matrix(b);
    }
#endif
  }
}